

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEmitter.cpp
# Opt level: O3

void __thiscall CodeEmitter::resolveReferences(CodeEmitter *this)

{
  pointer ppVar1;
  pointer pcVar2;
  iterator iVar3;
  undefined8 extraout_RAX;
  long lVar4;
  CodeEmitter *pCVar5;
  pointer ppVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> p;
  string dataReference;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  int local_98;
  key_type local_90;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  
  ppVar6 = (this->_dataReferences).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->_dataReferences).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar1) {
    do {
      pcVar2 = (ppVar6->first)._M_dataplus._M_p;
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar2,pcVar2 + (ppVar6->first)._M_string_length);
      local_98 = ppVar6->second;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b8,local_b8 + local_b0);
      lVar4 = (long)local_98;
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->_labels)._M_h,&local_90);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_50._M_p = &stack0xffffffffffffffc0;
        pCVar5 = (CodeEmitter *)&stack0xffffffffffffffb0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pCVar5,"unresolved data reference","");
        emitterError(pCVar5,(string *)&stack0xffffffffffffffb0);
        goto LAB_0010c35c;
      }
      (this->_words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar4].data =
           *(int *)((long)iVar3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          ._M_cur + 0x28) << 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar1);
  }
  ppVar6 = (this->_references).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->_references).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar1) {
    do {
      pcVar2 = (ppVar6->first)._M_dataplus._M_p;
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar2,pcVar2 + (ppVar6->first)._M_string_length);
      local_98 = ppVar6->second;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b8,local_b8 + local_b0);
      lVar4 = (long)local_98;
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->_labels)._M_h,&local_90);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
LAB_0010c35c:
        pCVar5 = (CodeEmitter *)local_70;
        local_70._0_8_ = local_70 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)pCVar5,"unresolved reference","");
        emitterError(pCVar5,(string *)local_70);
        if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
          operator_delete((void *)local_70._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        _Unwind_Resume(extraout_RAX);
      }
      *(short *)((long)(this->_words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4 * 4 + 2) =
           (short)(*(int *)((long)iVar3.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                  ._M_cur + 0x28) << 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar1);
  }
  return;
}

Assistant:

void CodeEmitter::resolveReferences() {
    for(auto p : _dataReferences) {
        std::string dataReference = p.first;
        int referenceWordIndex = p.second;
        auto it = _labels.find(dataReference);
        if(it == _labels.end()) {
            emitterError("unresolved data reference");
        } else {
            int labelWordIndex = it->second;
            _words[referenceWordIndex].data = labelWordIndex * 4;
            //std::cout << "resolving data reference: " << reference << ' ' << referenceWordIndex * 4 << ' ' << labelWordIndex * 4 << std::endl;
        }
    }
    for(auto p : _references) {
        std::string reference = p.first;
        int referenceWordIndex = p.second;
        auto it = _labels.find(reference);
        if(it == _labels.end()) {
            emitterError("unresolved reference");
        } else {
            int labelWordIndex = it->second;
            _words[referenceWordIndex].instruction.adr = labelWordIndex * 4;
            //std::cout << "resolving reference: " << reference << ' ' << referenceWordIndex * 4 << ' ' << labelWordIndex * 4 << std::endl;
        }
    }
}